

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hudmessages.cpp
# Opt level: O3

bool __thiscall DHUDMessageFadeOut::Tick(DHUDMessageFadeOut *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = (this->super_DHUDMessage).State;
  iVar2 = (this->super_DHUDMessage).Tics + 1;
  (this->super_DHUDMessage).Tics = iVar2;
  iVar3 = iVar2;
  if (iVar1 != 2) {
    if (iVar1 != 1) {
      return false;
    }
    iVar1 = (this->super_DHUDMessage).HoldTics;
    iVar3 = iVar2 - iVar1;
    if (iVar2 < iVar1) {
      return false;
    }
    (this->super_DHUDMessage).State = 2;
    (this->super_DHUDMessage).Tics = iVar3;
  }
  if (iVar3 < this->FadeOutTics) {
    return false;
  }
  return true;
}

Assistant:

bool DHUDMessageFadeOut::Tick ()
{
	Tics++;
	if (State == 1 && HoldTics <= Tics)
	{
		State++;
		Tics -= HoldTics;
	}
	if (State == 2 && FadeOutTics <= Tics)
	{
		return true;
	}
	return false;
}